

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

int __thiscall Algorithms::mobiusFunction(Algorithms *this,BigInteger *n)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  reference this_00;
  reference other;
  int local_a0;
  int local_9c;
  int i;
  int k;
  BigInteger local_88;
  undefined1 local_68 [8];
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> fact;
  BigInteger local_40;
  BigInteger *local_20;
  BigInteger *n_local;
  Algorithms *this_local;
  
  local_20 = n;
  n_local = (BigInteger *)this;
  BigIntegerLibrary::BigInteger::BigInteger(&local_40,1);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(n,&local_40);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_40);
  if (bVar1) {
    this_local._4_4_ = 1;
  }
  else {
    BigIntegerLibrary::BigInteger::BigInteger(&local_88,n);
    factorization((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                   *)local_68,this,&local_88);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_88);
    __first = std::
              vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
              ::begin((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                       *)local_68);
    __last = std::
             vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
             end((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                  *)local_68);
    std::
    sort<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>>
              ((__normal_iterator<BigIntegerLibrary::BigInteger_*,_std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>_>
                )__first._M_current,
               (__normal_iterator<BigIntegerLibrary::BigInteger_*,_std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>_>
                )__last._M_current);
    local_9c = 1;
    local_a0 = 1;
    while( true ) {
      sVar2 = std::
              vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
              ::size((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                      *)local_68);
      if (sVar2 <= (ulong)(long)local_a0) break;
      this_00 = std::
                vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                ::operator[]((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                              *)local_68,(long)local_a0);
      other = std::
              vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
              ::operator[]((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                            *)local_68,(long)(local_a0 + -1));
      bVar1 = BigIntegerLibrary::BigInteger::operator!=(this_00,other);
      if (!bVar1) {
        this_local._4_4_ = 0;
        goto LAB_0010c710;
      }
      local_9c = local_9c + 1;
      local_a0 = local_a0 + 1;
    }
    if (local_9c % 2 == 0) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = -1;
    }
LAB_0010c710:
    std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
    ~vector((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> *
            )local_68);
  }
  return this_local._4_4_;
}

Assistant:

int Algorithms::mobiusFunction(BigInteger n) {
    if (n == BigInteger(1)) {
        return 1;
    }
    auto fact = factorization(n);
    sort(fact.begin(), fact.end());
    int k = 1;
    for (int i = 1; i < fact.size(); ++i) {
        if (fact[i] != fact[i - 1]) {
            ++k;
        } else {
            return 0; // n % fact[i]^2 == 0
        }
    }
    if (k % 2) {
        return -1;
    }
    return 1;
}